

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbePmaWriteBlob(PmaWriter *p,u8 *pData,int nData)

{
  int iVar1;
  bool bVar2;
  int nRem;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = nData;
  if (0 < nData) {
    do {
      if (p->eFWErr != 0) {
        return;
      }
      iVar5 = p->nBuffer - p->iBufEnd;
      if (iVar3 < iVar5) {
        iVar5 = iVar3;
      }
      memcpy(p->aBuffer + p->iBufEnd,pData + (nData - iVar3),(long)iVar5);
      iVar4 = iVar5 + p->iBufEnd;
      p->iBufEnd = iVar4;
      if (iVar4 == p->nBuffer) {
        iVar1 = p->iBufStart;
        iVar4 = (*p->pFd->pMethods->xWrite)
                          (p->pFd,p->aBuffer + iVar1,iVar4 - iVar1,(long)iVar1 + p->iWriteOff);
        p->eFWErr = iVar4;
        p->iBufStart = 0;
        p->iBufEnd = 0;
        p->iWriteOff = p->iWriteOff + (long)p->nBuffer;
      }
      iVar4 = iVar3 - iVar5;
      bVar2 = iVar5 <= iVar3;
      iVar3 = iVar4;
    } while (iVar4 != 0 && bVar2);
  }
  return;
}

Assistant:

static void vdbePmaWriteBlob(PmaWriter *p, u8 *pData, int nData){
  int nRem = nData;
  while( nRem>0 && p->eFWErr==0 ){
    int nCopy = nRem;
    if( nCopy>(p->nBuffer - p->iBufEnd) ){
      nCopy = p->nBuffer - p->iBufEnd;
    }

    memcpy(&p->aBuffer[p->iBufEnd], &pData[nData-nRem], nCopy);
    p->iBufEnd += nCopy;
    if( p->iBufEnd==p->nBuffer ){
      p->eFWErr = sqlite3OsWrite(p->pFd, 
          &p->aBuffer[p->iBufStart], p->iBufEnd - p->iBufStart, 
          p->iWriteOff + p->iBufStart
      );
      p->iBufStart = p->iBufEnd = 0;
      p->iWriteOff += p->nBuffer;
    }
    assert( p->iBufEnd<p->nBuffer );

    nRem -= nCopy;
  }
}